

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctflt.c
# Opt level: O2

void jpeg_fdct_float(float *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  uVar5 = (ulong)start_col;
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
    lVar4 = *(long *)((long)sample_data + lVar6);
    bVar2 = *(byte *)(lVar4 + 7 + uVar5);
    iVar13 = (uint)bVar2 + (uint)*(byte *)(lVar4 + uVar5);
    iVar7 = (uint)*(byte *)(lVar4 + uVar5) - (uint)bVar2;
    bVar2 = *(byte *)(lVar4 + 1 + uVar5);
    bVar3 = *(byte *)(lVar4 + 6 + uVar5);
    iVar8 = (uint)bVar3 + (uint)bVar2;
    iVar10 = (uint)bVar2 - (uint)bVar3;
    bVar2 = *(byte *)(lVar4 + 2 + uVar5);
    bVar3 = *(byte *)(lVar4 + 5 + uVar5);
    iVar9 = (uint)bVar3 + (uint)bVar2;
    iVar11 = (uint)bVar2 - (uint)bVar3;
    bVar2 = *(byte *)(lVar4 + 3 + uVar5);
    bVar3 = *(byte *)(lVar4 + 4 + uVar5);
    iVar14 = (uint)bVar3 + (uint)bVar2;
    iVar12 = iVar14 + iVar13;
    iVar1 = iVar9 + iVar8;
    fVar16 = (float)iVar7;
    iVar13 = iVar13 - iVar14;
    fVar15 = (float)iVar13;
    data[lVar6] = (float)(iVar12 + -0x400 + iVar1);
    data[lVar6 + 4] = (float)(iVar12 - iVar1);
    fVar17 = (float)((iVar8 - iVar9) + iVar13) * 0.70710677;
    data[lVar6 + 2] = fVar17 + fVar15;
    iVar12 = ((uint)bVar2 - (uint)bVar3) + iVar11;
    iVar7 = iVar10 + iVar7;
    fVar20 = (float)(iVar12 - iVar7) * 0.38268343;
    fVar18 = (float)iVar12 * 0.5411961 + fVar20;
    fVar20 = (float)iVar7 * 1.306563 + fVar20;
    fVar19 = (float)(iVar11 + iVar10) * 0.70710677;
    fVar21 = fVar19 + fVar16;
    fVar16 = fVar16 - fVar19;
    data[lVar6 + 5] = fVar16 + fVar18;
    data[lVar6 + 3] = fVar16 - fVar18;
    data[lVar6 + 1] = fVar21 + fVar20;
    *(ulong *)(data + lVar6 + 6) = CONCAT44(fVar21 - fVar20,fVar15 - fVar17);
  }
  for (iVar12 = 7; -1 < iVar12; iVar12 = iVar12 + -1) {
    fVar17 = *data + data[0x38];
    fVar18 = *data - data[0x38];
    fVar20 = data[8] + data[0x30];
    fVar16 = data[8] - data[0x30];
    fVar21 = data[0x10] + data[0x28];
    fVar19 = data[0x10] - data[0x28];
    fVar15 = data[0x20];
    fVar23 = data[0x18] + fVar15;
    fVar22 = fVar17 + fVar23;
    fVar17 = fVar17 - fVar23;
    fVar23 = fVar20 + fVar21;
    *data = fVar23 + fVar22;
    data[0x20] = fVar22 - fVar23;
    fVar20 = ((fVar20 - fVar21) + fVar17) * 0.70710677;
    data[0x10] = fVar17 + fVar20;
    data[0x30] = fVar17 - fVar20;
    fVar20 = (data[0x18] - fVar15) + fVar19;
    fVar15 = fVar16 + fVar18;
    fVar17 = (fVar20 - fVar15) * 0.38268343;
    fVar20 = fVar20 * 0.5411961 + fVar17;
    fVar17 = fVar15 * 1.306563 + fVar17;
    fVar15 = (fVar19 + fVar16) * 0.70710677;
    fVar16 = fVar18 + fVar15;
    fVar18 = fVar18 - fVar15;
    data[0x28] = fVar18 + fVar20;
    data[0x18] = fVar18 - fVar20;
    data[8] = fVar16 + fVar17;
    data[0x38] = fVar16 - fVar17;
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_float (FAST_FLOAT * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z1, z2, z3, z4, z5, z11, z13;
  FAST_FLOAT *dataptr;
  JSAMPROW elemptr;
  int ctr;

  /* Pass 1: process rows. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Load data into workspace */
    tmp0 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]));
    tmp7 = (FAST_FLOAT) (GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]));
    tmp1 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]));
    tmp6 = (FAST_FLOAT) (GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]));
    tmp2 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]));
    tmp5 = (FAST_FLOAT) (GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]));
    tmp3 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]));
    tmp4 = (FAST_FLOAT) (GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]));

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Apply unsigned->signed conversion */
    dataptr[0] = tmp10 + tmp11 - 8 * CENTERJSAMPLE; /* phase 3 */
    dataptr[4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[2] = tmp13 + z1;	/* phase 5 */
    dataptr[6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[5] = z13 + z2;	/* phase 6 */
    dataptr[3] = z13 - z2;
    dataptr[1] = z11 + z4;
    dataptr[7] = z11 - z4;

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns. */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp7 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp6 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp5 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    /* Even part */

    tmp10 = tmp0 + tmp3;	/* phase 2 */
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE*0] = tmp10 + tmp11; /* phase 3 */
    dataptr[DCTSIZE*4] = tmp10 - tmp11;

    z1 = (tmp12 + tmp13) * ((FAST_FLOAT) 0.707106781); /* c4 */
    dataptr[DCTSIZE*2] = tmp13 + z1; /* phase 5 */
    dataptr[DCTSIZE*6] = tmp13 - z1;

    /* Odd part */

    tmp10 = tmp4 + tmp5;	/* phase 2 */
    tmp11 = tmp5 + tmp6;
    tmp12 = tmp6 + tmp7;

    /* The rotator is modified from fig 4-8 to avoid extra negations. */
    z5 = (tmp10 - tmp12) * ((FAST_FLOAT) 0.382683433); /* c6 */
    z2 = ((FAST_FLOAT) 0.541196100) * tmp10 + z5; /* c2-c6 */
    z4 = ((FAST_FLOAT) 1.306562965) * tmp12 + z5; /* c2+c6 */
    z3 = tmp11 * ((FAST_FLOAT) 0.707106781); /* c4 */

    z11 = tmp7 + z3;		/* phase 5 */
    z13 = tmp7 - z3;

    dataptr[DCTSIZE*5] = z13 + z2; /* phase 6 */
    dataptr[DCTSIZE*3] = z13 - z2;
    dataptr[DCTSIZE*1] = z11 + z4;
    dataptr[DCTSIZE*7] = z11 - z4;

    dataptr++;			/* advance pointer to next column */
  }
}